

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ec_seckey_tweak_mul(secp256k1_context *ctx,uchar *seckey,uchar *tweak)

{
  uint uVar1;
  void *pvVar2;
  char *pcVar3;
  int overflow;
  int local_6c;
  secp256k1_scalar local_68;
  secp256k1_scalar local_48;
  
  local_6c = 0;
  if (seckey == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "seckey != NULL";
  }
  else {
    if (tweak != (uchar *)0x0) {
      secp256k1_scalar_set_b32(&local_48,tweak,&local_6c);
      uVar1 = secp256k1_scalar_set_b32_seckey(&local_68,seckey);
      if ((local_48.d[3] == 0 && local_48.d[1] == 0) && (local_48.d[2] == 0 && local_48.d[0] == 0))
      {
        uVar1 = 0;
      }
      if (local_6c != 0) {
        uVar1 = 0;
      }
      secp256k1_scalar_mul(&local_68,&local_68,&local_48);
      secp256k1_scalar_cmov(&local_68,&secp256k1_scalar_zero,uVar1 ^ 1);
      secp256k1_scalar_get_b32(seckey,&local_68);
      return uVar1;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "tweak != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_ec_seckey_tweak_mul(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak) {
    secp256k1_scalar factor;
    secp256k1_scalar sec;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak != NULL);

    secp256k1_scalar_set_b32(&factor, tweak, &overflow);
    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    ret &= (!overflow) & secp256k1_eckey_privkey_tweak_mul(&sec, &factor);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_clear(&factor);
    return ret;
}